

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O3

TPZFMatrix<long_double> * __thiscall
TPZMatrix<long_double>::Storage
          (TPZFMatrix<long_double> *__return_storage_ptr__,TPZMatrix<long_double> *this)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int64_t size;
  long lVar2;
  
  iVar1 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x4b])(this);
  lVar2 = CONCAT44(extraout_var,iVar1);
  iVar1 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x4d])(this);
  (__return_storage_ptr__->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow = lVar2;
  (__return_storage_ptr__->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol = 1;
  (__return_storage_ptr__->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fDecomposed = '\0';
  (__return_storage_ptr__->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fDefPositive = '\0';
  (__return_storage_ptr__->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_0181e1d8;
  __return_storage_ptr__->fElem = (longdouble *)CONCAT44(extraout_var_00,iVar1);
  __return_storage_ptr__->fGiven = (longdouble *)CONCAT44(extraout_var_00,iVar1);
  __return_storage_ptr__->fSize = lVar2;
  TPZVec<int>::TPZVec(&(__return_storage_ptr__->fPivot).super_TPZVec<int>,0);
  (__return_storage_ptr__->fPivot).super_TPZVec<int>._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_01815498;
  (__return_storage_ptr__->fPivot).super_TPZVec<int>.fStore =
       (__return_storage_ptr__->fPivot).fExtAlloc;
  (__return_storage_ptr__->fPivot).super_TPZVec<int>.fNElements = 0;
  (__return_storage_ptr__->fPivot).super_TPZVec<int>.fNAlloc = 0;
  (__return_storage_ptr__->fWork)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813e70;
  (__return_storage_ptr__->fWork).fStore = (longdouble *)0x0;
  (__return_storage_ptr__->fWork).fNElements = 0;
  (__return_storage_ptr__->fWork).fNAlloc = 0;
  if (lVar2 == 0) {
    __return_storage_ptr__->fElem = (longdouble *)0x0;
  }
  return __return_storage_ptr__;
}

Assistant:

const TPZFMatrix<TVar> TPZMatrix<TVar>::Storage() const
{
  const auto size = Size();
  const auto elem = Elem();
	TPZFMatrix<TVar> ref(size,1,const_cast<TVar*>(elem),size);
	return ref;
}